

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.hpp
# Opt level: O2

void __thiscall jsoncons::not_an_object::~not_an_object(not_an_object *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->super_runtime_error + *(long *)((long)pvVar1 + -0x18)) = vtt[1];
  std::__cxx11::string::~string((string *)&this->what_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::runtime_error::what());
                    what_.append(": '");
                    what_.append(name_);
                    what_.append("'");
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::runtime_error::what();
                }
            }